

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprNeedsNoAffinityChange(Expr *p,char aff)

{
  byte bVar1;
  bool bVar2;
  
  bVar2 = true;
  if (aff == 'A') goto LAB_00175eb7;
  while (bVar1 = p->op, bVar1 - 0x9b < 2) {
    p = p->pLeft;
  }
  if (bVar1 == 0x9d) {
    bVar1 = p->op2;
  }
  if (bVar1 < 0x85) {
    if (bVar1 == 0x61) {
      bVar2 = aff == 'B';
      goto LAB_00175eb7;
    }
    if (bVar1 == 0x84) {
      bVar2 = (aff + 0xbdU & 0xfd) == 0;
      goto LAB_00175eb7;
    }
  }
  else {
    if (bVar1 == 0x85) goto LAB_00175eb7;
    if (bVar1 == 0x98) {
      bVar2 = (byte)(aff + 0xbdU) < 2 && p->iColumn < 0;
      goto LAB_00175eb7;
    }
    if (bVar1 == 0x86) {
      bVar2 = (byte)(aff + 0xbdU) < 2;
      goto LAB_00175eb7;
    }
  }
  bVar2 = false;
LAB_00175eb7:
  return (int)bVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprNeedsNoAffinityChange(const Expr *p, char aff){
  u8 op;
  if( aff==SQLITE_AFF_BLOB ) return 1;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){ p = p->pLeft; }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER: {
      return aff==SQLITE_AFF_INTEGER || aff==SQLITE_AFF_NUMERIC;
    }
    case TK_FLOAT: {
      return aff==SQLITE_AFF_REAL || aff==SQLITE_AFF_NUMERIC;
    }
    case TK_STRING: {
      return aff==SQLITE_AFF_TEXT;
    }
    case TK_BLOB: {
      return 1;
    }
    case TK_COLUMN: {
      assert( p->iTable>=0 );  /* p cannot be part of a CHECK constraint */
      return p->iColumn<0
          && (aff==SQLITE_AFF_INTEGER || aff==SQLITE_AFF_NUMERIC);
    }
    default: {
      return 0;
    }
  }
}